

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyInstance::iterate
          (TestStatus *__return_storage_ptr__,FilteringAnisotropyInstance *this)

{
  TestLog *pTVar1;
  float fVar2;
  bool bVar3;
  int cellSize;
  VkPhysicalDeviceFeatures *pVVar4;
  TestTexture2D *this_00;
  NotSupportedError *this_01;
  int levelNdx;
  uint uVar5;
  ConstPixelBufferAccess local_378;
  TestTexture2DSp texture;
  Surface renderedAnisotropyFrame;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  float position [16];
  ConstPixelBufferAccess local_2a0;
  Vector<float,_4> local_278;
  TextureRenderer renderer;
  
  pVVar4 = Context::getDeviceFeatures((this->super_TestInstance).m_context);
  if (pVVar4->samplerAnisotropy == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,
               "Skipping anisotropic tests since the device does not support anisotropic filtering."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringAnisotropyTests.cpp"
               ,0x68);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  util::TextureRenderer::TextureRenderer
            (&renderer,(this->super_TestInstance).m_context,VK_SAMPLE_COUNT_1_BIT,0x80,0x80);
  this_00 = (TestTexture2D *)operator_new(0x70);
  position._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture2D::TestTexture2D(this_00,(TextureFormat *)position,0x80,0x80);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(&texture,this_00);
  for (uVar5 = 0; (int)uVar5 < (this->m_refParams).super_ReferenceParams.maxLevel + 1;
      uVar5 = uVar5 + 1) {
    (*((texture.m_ptr)->super_TestTexture)._vptr_TestTexture[7])
              ((PixelBufferAccess *)position,texture.m_ptr,(ulong)uVar5,0);
    fVar2 = position[3];
    (*((texture.m_ptr)->super_TestTexture)._vptr_TestTexture[7])
              ((PixelBufferAccess *)position,texture.m_ptr,(ulong)uVar5,0);
    cellSize = (int)fVar2 / 8;
    if (cellSize < 2) {
      cellSize = 1;
    }
    local_378.m_format.order = R;
    local_378.m_format.type = SNORM_INT8;
    local_378.m_size.m_data[0] = 0;
    local_378.m_size.m_data[1] = 0x3f800000;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_2a0,1.0);
    tcu::fillWithGrid((PixelBufferAccess *)position,cellSize,(Vec4 *)&local_378,(Vec4 *)&local_2a0);
  }
  util::TextureRenderer::setViewport(&renderer,0.0,0.0,128.0,128.0);
  util::TextureRenderer::add2DTexture(&renderer,&texture);
  tcu::Surface::Surface(&renderedFrame,0x80,0x80);
  tcu::Surface::Surface(&renderedAnisotropyFrame,0x80,0x80);
  position[0xc] = 3.5;
  position[0xd] = 1.0;
  position[0xe] = 0.0;
  position[0xf] = 1.0;
  position[8] = 3.5;
  position[9] = -1.0;
  position[10] = 0.0;
  position[0xb] = 3.5;
  position[4] = -3.5;
  position[5] = 1.0;
  position[6] = 0.0;
  position[7] = 1.0;
  position[0] = -3.5;
  position[1] = -1.0;
  position[2] = 0.0;
  position[3] = 3.5;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_378.m_format.order = R;
  local_378.m_format.type = SNORM_INT8;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a0.m_format = (TextureFormat)&DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)&local_378,(Vec2 *)&local_2a0);
  util::TextureRenderer::renderQuad
            (&renderer,&renderedFrame,position,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&(this->m_refParams).super_ReferenceParams,1.0);
  util::TextureRenderer::renderQuad
            (&renderer,&renderedAnisotropyFrame,position,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&(this->m_refParams).super_ReferenceParams,
             (this->m_refParams).maxAnisotropy);
  pTVar1 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_378,&renderedFrame);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_2a0,&renderedAnisotropyFrame);
  bVar3 = tcu::fuzzyCompare(pTVar1,"Expecting comparison to pass","Expecting comparison to pass",
                            &local_378,&local_2a0,0.05,COMPARE_LOG_RESULT);
  if (bVar3) {
    pTVar1 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_378,&renderedFrame);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2a0,&renderedAnisotropyFrame);
    tcu::Vector<float,_4>::Vector(&local_278,0.05);
    bVar3 = tcu::floatThresholdCompare
                      (pTVar1,"Expecting comparison to fail","Expecting comparison to fail",
                       &local_378,&local_2a0,&local_278,COMPARE_LOG_RESULT);
    if (!bVar3) {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
      tcu::Surface::~Surface(&renderedAnisotropyFrame);
      tcu::Surface::~Surface(&renderedFrame);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)position,"Pass",(allocator<char> *)&local_378);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)position);
      std::__cxx11::string::~string((string *)position);
      goto LAB_0076c200;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"Fail",(allocator<char> *)&local_2a0);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_378);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"Fail",(allocator<char> *)&local_2a0);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_378);
  }
  std::__cxx11::string::~string((string *)&local_378);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&renderedAnisotropyFrame);
  tcu::Surface::~Surface(&renderedFrame);
LAB_0076c200:
  de::SharedPtr<vkt::pipeline::TestTexture2D>::~SharedPtr(&texture);
  util::TextureRenderer::~TextureRenderer(&renderer);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate	(void)
	{
		// Check device for anisotropic filtering support
		if (!m_context.getDeviceFeatures().samplerAnisotropy)
			TCU_THROW(NotSupportedError, "Skipping anisotropic tests since the device does not support anisotropic filtering.");

		TextureRenderer	renderer	(m_context, VK_SAMPLE_COUNT_1_BIT, ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
		TestTexture2DSp	texture		= TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM), ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION));

		for (int levelNdx = 0; levelNdx < m_refParams.maxLevel + 1; levelNdx++)
		{
			const int gridSize = max(texture->getLevel(levelNdx, 0).getHeight() / 8, 1);
			tcu::fillWithGrid(texture->getLevel(levelNdx, 0), gridSize, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4(1.0f));
		}

		renderer.setViewport(0.0f, 0.0f, static_cast<float>(ANISOTROPY_TEST_RESOLUTION), static_cast<float>(ANISOTROPY_TEST_RESOLUTION));
		renderer.add2DTexture(texture);

		{
			Surface			renderedFrame			(ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
			Surface			renderedAnisotropyFrame	(ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
			const float		position[]				=
			{
				-3.5f, -1.0f, 0.0f, 3.5f,
				-3.5f, +1.0f, 0.0f, 1.0f,
				+3.5f, -1.0f, 0.0f, 3.5f,
				+3.5f, +1.0f, 0.0f, 1.0f
			};
			vector<float>	texCoord;

			computeQuadTexCoord2D(texCoord, Vec2(0.0f), Vec2(1.0f));

			renderer.renderQuad(renderedFrame,				position, 0, &texCoord[0], m_refParams, 1.0f);
			renderer.renderQuad(renderedAnisotropyFrame,	position, 0, &texCoord[0], m_refParams, m_refParams.maxAnisotropy);

			if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "Expecting comparison to pass", "Expecting comparison to pass",
					renderedFrame.getAccess(), renderedAnisotropyFrame.getAccess(), 0.05f, tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::fail("Fail");

			if (floatThresholdCompare (m_context.getTestContext().getLog(), "Expecting comparison to fail", "Expecting comparison to fail",
					renderedFrame.getAccess(), renderedAnisotropyFrame.getAccess(), Vec4(0.05f), tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::fail("Fail");
		}
		return tcu::TestStatus::pass("Pass");
	}